

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::ColorTooltip(char *text,float *col,ImGuiColorEditFlags flags)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint in_EDX;
  float *in_RSI;
  char *in_RDI;
  float fVar4;
  int ca;
  int cb;
  int cg;
  int cr;
  ImVec4 cf;
  ImVec2 sz;
  char *text_end;
  ImGuiContext *g;
  ImGuiTextFlags in_stack_000000a4;
  char *in_stack_000000a8;
  char *in_stack_000000b0;
  ImVec2 *in_stack_00000100;
  ImGuiColorEditFlags in_stack_0000010c;
  ImVec4 *in_stack_00000110;
  char *in_stack_00000118;
  uint local_6c;
  float local_68;
  char *local_58;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  ImVec2 local_30;
  char *local_28;
  ImGuiContext *local_20;
  uint local_14;
  float *local_10;
  char *local_8;
  
  local_20 = GImGui;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  BeginTooltipEx((ImGuiTooltipFlags)in_stack_ffffffffffffffc4,
                 (ImGuiWindowFlags)in_stack_ffffffffffffffc0);
  if (local_8 == (char *)0x0) {
    local_58 = local_8;
  }
  else {
    local_58 = FindRenderedTextEnd(local_8,(char *)0x0);
  }
  local_28 = local_58;
  if (local_8 < local_58) {
    TextEx(in_stack_000000b0,in_stack_000000a8,in_stack_000000a4);
    Separator();
  }
  ImVec2::ImVec2(&local_30,local_20->FontSize * 3.0 + (local_20->Style).FramePadding.y * 2.0,
                 local_20->FontSize * 3.0 + (local_20->Style).FramePadding.y * 2.0);
  if ((local_14 & 2) == 0) {
    local_68 = local_10[3];
  }
  else {
    local_68 = 1.0;
  }
  ImVec4::ImVec4((ImVec4 *)&stack0xffffffffffffffc0,*local_10,local_10[1],local_10[2],local_68);
  fVar4 = ImSaturate(*local_10);
  uVar1 = (uint)(fVar4 * 255.0 + 0.5);
  fVar4 = ImSaturate(local_10[1]);
  uVar2 = (uint)(fVar4 * 255.0 + 0.5);
  fVar4 = ImSaturate(local_10[2]);
  uVar3 = (uint)(fVar4 * 255.0 + 0.5);
  if ((local_14 & 2) == 0) {
    fVar4 = ImSaturate(local_10[3]);
    local_6c = (uint)(fVar4 * 255.0 + 0.5);
  }
  else {
    local_6c = 0xff;
  }
  ColorButton(in_stack_00000118,in_stack_00000110,in_stack_0000010c,in_stack_00000100);
  SameLine(0.0,-1.0);
  if (((local_14 & 0x8000000) == 0) && ((local_14 & 0x18000000) != 0)) {
    if ((local_14 & 0x10000000) != 0) {
      if ((local_14 & 2) == 0) {
        Text((char *)(double)*local_10,(double)local_10[1],(double)local_10[2],(double)local_10[3],
             "H: %.3f, S: %.3f, V: %.3f, A: %.3f");
      }
      else {
        Text((char *)(double)*local_10,(double)local_10[1],(double)local_10[2],
             "H: %.3f, S: %.3f, V: %.3f");
      }
    }
  }
  else if ((local_14 & 2) == 0) {
    Text((char *)(double)*local_10,(double)local_10[1],(double)local_10[2],(double)local_10[3],
         "#%02X%02X%02X%02X\nR:%d, G:%d, B:%d, A:%d\n(%.3f, %.3f, %.3f, %.3f)",(ulong)uVar1,
         (ulong)uVar2,(ulong)uVar3,(ulong)local_6c,(ulong)uVar1,uVar2,uVar3,local_6c);
  }
  else {
    Text((char *)(double)*local_10,(double)local_10[1],(double)local_10[2],
         "#%02X%02X%02X\nR: %d, G: %d, B: %d\n(%.3f, %.3f, %.3f)",(ulong)uVar1,(ulong)uVar2,
         (ulong)uVar3,(ulong)uVar1,(ulong)uVar2,uVar3);
  }
  EndTooltip();
  return;
}

Assistant:

void ImGui::ColorTooltip(const char* text, const float* col, ImGuiColorEditFlags flags)
{
    ImGuiContext& g = *GImGui;

    BeginTooltipEx(ImGuiTooltipFlags_OverridePreviousTooltip, ImGuiWindowFlags_None);
    const char* text_end = text ? FindRenderedTextEnd(text, NULL) : text;
    if (text_end > text)
    {
        TextEx(text, text_end);
        Separator();
    }

    ImVec2 sz(g.FontSize * 3 + g.Style.FramePadding.y * 2, g.FontSize * 3 + g.Style.FramePadding.y * 2);
    ImVec4 cf(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
    int cr = IM_F32_TO_INT8_SAT(col[0]), cg = IM_F32_TO_INT8_SAT(col[1]), cb = IM_F32_TO_INT8_SAT(col[2]), ca = (flags & ImGuiColorEditFlags_NoAlpha) ? 255 : IM_F32_TO_INT8_SAT(col[3]);
    ColorButton("##preview", cf, (flags & (ImGuiColorEditFlags_InputMask_ | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf)) | ImGuiColorEditFlags_NoTooltip, sz);
    SameLine();
    if ((flags & ImGuiColorEditFlags_InputRGB) || !(flags & ImGuiColorEditFlags_InputMask_))
    {
        if (flags & ImGuiColorEditFlags_NoAlpha)
            Text("#%02X%02X%02X\nR: %d, G: %d, B: %d\n(%.3f, %.3f, %.3f)", cr, cg, cb, cr, cg, cb, col[0], col[1], col[2]);
        else
            Text("#%02X%02X%02X%02X\nR:%d, G:%d, B:%d, A:%d\n(%.3f, %.3f, %.3f, %.3f)", cr, cg, cb, ca, cr, cg, cb, ca, col[0], col[1], col[2], col[3]);
    }
    else if (flags & ImGuiColorEditFlags_InputHSV)
    {
        if (flags & ImGuiColorEditFlags_NoAlpha)
            Text("H: %.3f, S: %.3f, V: %.3f", col[0], col[1], col[2]);
        else
            Text("H: %.3f, S: %.3f, V: %.3f, A: %.3f", col[0], col[1], col[2], col[3]);
    }
    EndTooltip();
}